

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

uint64_t fio_atol_consume(char **pstr,uint8_t base)

{
  bool bVar1;
  uint64_t limit;
  uint64_t result;
  uint8_t base_local;
  char **pstr_local;
  
  limit = 0;
  while( true ) {
    bVar1 = false;
    if (('/' < **pstr) && (bVar1 = false, (int)**pstr < (int)(base + 0x30))) {
      bVar1 = limit <= -(long)(int)((uint)base * (uint)base) - 1U;
    }
    if (!bVar1) break;
    limit = limit * base + (long)(**pstr + -0x30);
    *pstr = *pstr + 1;
  }
  return limit;
}

Assistant:

FIO_FUNC inline uint64_t fio_atol_consume(char **pstr, uint8_t base) {
  uint64_t result = 0;
  const uint64_t limit = UINT64_MAX - (base * base);
  while (**pstr >= '0' && **pstr < ('0' + base) && result <= (limit)) {
    result = (result * base) + (**pstr - '0');
    ++(*pstr);
  }
  return result;
}